

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

Vec_Str_t * Gia_AigerWriteMapping(Gia_Man_t *p)

{
  uchar *pArray;
  Vec_Str_t *pVVar1;
  uchar *pBuffer;
  Gia_Man_t *pGStack_10;
  int nMapSize;
  Gia_Man_t *p_local;
  
  pGStack_10 = p;
  pArray = Gia_AigerWriteMappingInt(p,(int *)((long)&pBuffer + 4));
  pVVar1 = Vec_StrAllocArray((char *)pArray,pBuffer._4_4_);
  return pVVar1;
}

Assistant:

Vec_Str_t * Gia_AigerWriteMapping( Gia_Man_t * p )
{
    int nMapSize;
    unsigned char * pBuffer = Gia_AigerWriteMappingInt( p, &nMapSize );
    return Vec_StrAllocArray( (char *)pBuffer, nMapSize );
}